

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

_Bool roaring64_bitmap_get_index(roaring64_bitmap_t *r,uint64_t val,uint64_t *out_index)

{
  int iVar1;
  long *in_RDX;
  int index16;
  int compare_result;
  leaf_t *leaf;
  uint64_t index;
  art_iterator_t it;
  uint16_t low16;
  uint8_t high48 [6];
  uint in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  uint64_t in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 first;
  long lVar2;
  art_t *in_stack_ffffffffffffff50;
  art_key_chunk_t *local_a8;
  
  first = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
  split_key(in_stack_ffffffffffffff40,
            (uint8_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  art_init_iterator(in_stack_ffffffffffffff50,(_Bool)first);
  lVar2 = 0;
  while( true ) {
    if (local_a8 == (art_key_chunk_t *)0x0) {
      return false;
    }
    in_stack_ffffffffffffff3c =
         compare_high48(local_a8,(art_key_chunk_t *)
                                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (-1 < in_stack_ffffffffffffff3c) break;
    iVar1 = container_get_cardinality
                      ((container_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       '\0');
    lVar2 = iVar1 + lVar2;
    art_iterator_next((art_iterator_t *)0x105ea4);
  }
  if (in_stack_ffffffffffffff3c == 0) {
    iVar1 = container_get_index((container_t *)(ulong)in_stack_ffffffffffffff38,'\0',0);
    if (iVar1 < 0) {
      return false;
    }
    *in_RDX = lVar2 + iVar1;
    return true;
  }
  return false;
}

Assistant:

bool roaring64_bitmap_get_index(const roaring64_bitmap_t *r, uint64_t val,
                                uint64_t *out_index) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);

    art_iterator_t it = art_init_iterator(&r->art, /*first=*/true);
    uint64_t index = 0;
    while (it.value != NULL) {
        leaf_t *leaf = (leaf_t *)it.value;
        int compare_result = compare_high48(it.key, high48);
        if (compare_result < 0) {
            index += container_get_cardinality(leaf->container, leaf->typecode);
        } else if (compare_result == 0) {
            int index16 =
                container_get_index(leaf->container, leaf->typecode, low16);
            if (index16 < 0) {
                return false;
            }
            *out_index = index + index16;
            return true;
        } else {
            return false;
        }
        art_iterator_next(&it);
    }
    return false;
}